

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

TSentences * __thiscall
NJamSpell::TTokenizer::Process
          (TSentences *__return_storage_ptr__,TTokenizer *this,wstring *originalText)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  wchar_t *pwVar4;
  TWord local_90;
  _Node_iterator_base<wchar_t,_false> local_80;
  _Node_iterator_base<wchar_t,_false> local_78 [3];
  wchar_t local_5c;
  ulong uStack_58;
  wchar_t letter;
  size_t i;
  TWord currWord;
  TWords currSentence;
  wstring *originalText_local;
  TTokenizer *this_local;
  TSentences *sentences;
  
  uVar2 = std::__cxx11::wstring::empty();
  if ((uVar2 & 1) == 0) {
    std::
    vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    ::vector(__return_storage_ptr__);
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currWord.Len);
    TWord::TWord((TWord *)&i);
    for (uStack_58 = 0; uVar2 = uStack_58, uVar3 = std::__cxx11::wstring::size(), uVar2 < uVar3;
        uStack_58 = uStack_58 + 1) {
      pwVar4 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)originalText);
      local_5c = std::tolower<wchar_t>(*pwVar4,&this->Locale);
      local_78[0]._M_cur =
           (__node_type *)
           std::
           unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
           ::find(&this->Alphabet,&local_5c);
      local_80._M_cur =
           (__node_type *)
           std::
           unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
           ::end(&this->Alphabet);
      bVar1 = std::__detail::operator!=(local_78,&local_80);
      if (bVar1) {
        if (i == 0) {
          i = std::__cxx11::wstring::operator[]((ulong)originalText);
        }
        currWord.Ptr = (wchar_t *)((long)currWord.Ptr + 1);
      }
      else if (i != 0) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currWord.Len,
                   (value_type *)&i);
        memset(&local_90,0,0x10);
        TWord::TWord(&local_90);
        i = (size_t)local_90.Ptr;
        currWord.Ptr = (wchar_t *)local_90.Len;
      }
      if ((((local_5c == L'?') || (local_5c == L'!')) || (local_5c == L'.')) &&
         (bVar1 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::empty
                            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                             &currWord.Len), !bVar1)) {
        std::
        vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&currWord.Len);
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::clear
                  ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currWord.Len);
      }
    }
    if (i != 0) {
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currWord.Len,
                 (value_type *)&i);
    }
    bVar1 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::empty
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currWord.Len)
    ;
    if (!bVar1) {
      std::
      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&currWord.Len);
    }
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)&currWord.Len);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

TSentences TTokenizer::Process(const std::wstring& originalText) const {
    if (originalText.empty()) {
        return TSentences();
    }

    TSentences sentences;

    TWords currSentence;
    TWord currWord;

    for (size_t i = 0; i < originalText.size(); ++i) {
        wchar_t letter = std::tolower(originalText[i], Locale);
        if (Alphabet.find(letter) != Alphabet.end()) {
            if (currWord.Ptr == nullptr) {
                currWord.Ptr = &originalText[i];
            }
            currWord.Len += 1;
        } else {
            if (currWord.Ptr != nullptr) {
                currSentence.push_back(currWord);
                currWord = TWord();
            }
        }
        if (letter == L'?' || letter == L'!' || letter == L'.') {
            if (!currSentence.empty()) {
                sentences.push_back(currSentence);
                currSentence.clear();
            }
        }
    }
    if (currWord.Ptr != nullptr) {
        currSentence.push_back(currWord);
    }
    if (!currSentence.empty()) {
        sentences.push_back(currSentence);
    }

    return sentences;
}